

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

void set_storage_state(void)

{
  LispPTR LVar1;
  
  if ((*MACHINETYPE_word & 0xffff) == 3) {
    if (InterfacePage->dl24bitaddressable == 0) {
      *STORAGEFULLSTATE_word = 0xe0001;
    }
    else {
      *STORAGEFULLSTATE_word = 0xe0002;
    }
    LVar1 = cons(STORAGEFULLSTATE_index,*SYSTEMCACHEVARS_word);
    *SYSTEMCACHEVARS_word = LVar1;
    if (((*(ushort *)((ulong)(MDStypetbl + (*SYSTEMCACHEVARS_word >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(*SYSTEMCACHEVARS_word,0);
      }
      else {
        htfind(*SYSTEMCACHEVARS_word,0);
      }
    }
  }
  else {
    error("set_storage_state: Sorry! We can work on only Maiko");
  }
  return;
}

Assistant:

static void set_storage_state(void) {
  if ((*MACHINETYPE_word & 0xffff) == MACHINETYPE_MAIKO) {
    if (InterfacePage->dl24bitaddressable != 0)
      *STORAGEFULLSTATE_word = S_POSITIVE | SFS_SWITCHABLE;
    else
      *STORAGEFULLSTATE_word = S_POSITIVE | SFS_NOTSWITCHABLE;

    *SYSTEMCACHEVARS_word = cons(STORAGEFULLSTATE_index, *SYSTEMCACHEVARS_word);

    GCLOOKUP(*SYSTEMCACHEVARS_word, ADDREF);

#ifdef DEBUG
    printf("SETSTATE: set to %d \n", (*STORAGEFULLSTATE_word) & 0xffff);
#endif
  } else {
    error("set_storage_state: Sorry! We can work on only Maiko");
  }

}